

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_align<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                 *handler)

{
  char cVar1;
  align_t align;
  char *pcVar2;
  type tVar3;
  bool bVar4;
  basic_string_view<char> fill;
  
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                ,0x9ad,"");
  }
  pcVar2 = next_code_point<char>(begin,end);
  if (pcVar2 == end) {
    pcVar2 = begin;
  }
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '^') {
      align = center;
LAB_0021658b:
      if ((long)pcVar2 - (long)begin != 0) {
        if (*begin == '{') {
          specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::on_error(&handler->
                      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     ,"invalid fill character \'{\'");
          return begin;
        }
        tVar3 = to_unsigned<long>((long)pcVar2 - (long)begin);
        fill.size_ = tVar3;
        fill.data_ = begin;
        specs_setter<char>::on_fill((specs_setter<char> *)handler,fill);
        begin = pcVar2;
      }
      specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
      ::on_align(handler,align);
      return begin + 1;
    }
    if (cVar1 == '>') {
      align = right;
      goto LAB_0021658b;
    }
    if (cVar1 == '<') {
      align = left;
      goto LAB_0021658b;
    }
    bVar4 = pcVar2 == begin;
    pcVar2 = begin;
    if (bVar4) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = next_code_point(begin, end);
  if (p == end) p = begin;
  for (;;) {
    switch (static_cast<char>(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_DEPRECATED_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}